

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face.c
# Opt level: O1

bool_t prf_face_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t *buffer;
  uint uVar1;
  uint len;
  bool_t bVar2;
  
  if (node->opcode == prf_face_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    buffer = node->data;
    bf_write(bfile,buffer,8);
    bf_put_int32_be(bfile,*(int32_t *)(buffer + 8));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0xc));
    bf_put_int8(bfile,buffer[0xe]);
    bf_put_int8(bfile,buffer[0xf]);
    bf_put_uint16_be(bfile,*(uint16_t *)(buffer + 0x10));
    bf_put_uint16_be(bfile,*(uint16_t *)(buffer + 0x12));
    bf_put_int8(bfile,buffer[0x14]);
    bf_put_int8(bfile,buffer[0x15]);
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x16));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x18));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x1a));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x1c));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x1e));
    bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x20));
    bf_put_uint16_be(bfile,*(uint16_t *)(buffer + 0x24));
    bf_put_uint8(bfile,buffer[0x26]);
    bf_put_uint8(bfile,buffer[0x27]);
    uVar1 = 0x2c;
    if (0x2f < node->length) {
      bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x28));
      uVar1 = 0x30;
      if (0x30 < node->length) {
        bf_put_uint8(bfile,buffer[0x2c]);
        uVar1 = 0x31;
        if (0x31 < node->length) {
          bf_put_uint8(bfile,buffer[0x2d]);
          uVar1 = 0x32;
          if (0x33 < node->length) {
            bf_put_uint16_be(bfile,*(uint16_t *)(buffer + 0x2e));
            uVar1 = 0x34;
            if (0x37 < node->length) {
              bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x30));
              uVar1 = 0x38;
              if (0x3b < node->length) {
                bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x34));
                uVar1 = 0x3c;
                if (0x3f < node->length) {
                  bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x38));
                  uVar1 = 0x40;
                  if (0x41 < node->length) {
                    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x3c));
                    uVar1 = 0x42;
                    if (0x43 < node->length) {
                      bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x3e));
                      uVar1 = 0x44;
                      if (0x47 < node->length) {
                        bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x40));
                        uVar1 = 0x48;
                        if (0x4b < node->length) {
                          bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0x44));
                          uVar1 = 0x4c;
                          if (0x4d < node->length) {
                            bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x48));
                            uVar1 = 0x4e;
                            if (0x4f < node->length) {
                              bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x4a));
                              uVar1 = 0x50;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar2 = 1;
    len = node->length - uVar1;
    if (uVar1 <= node->length && len != 0) {
      bf_write(bfile,node->data + ((ulong)uVar1 - 4),len);
    }
  }
  else {
    bVar2 = 0;
    prf_error(6,"tried face node save method for other node type");
  }
  return bVar2;
}

Assistant:

static
bool_t
prf_face_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_face_info.opcode ) {
        prf_error( 6, "tried face node save method for other node type" );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        bf_write( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        bf_put_int32_be( bfile, data->ir_color_code ); pos += 4;
        bf_put_int16_be( bfile, data->relative_priority ); pos += 2;
        bf_put_int8( bfile, data->draw_type ); pos += 1;
        bf_put_int8( bfile, data->texture_white ); pos += 1;
        bf_put_uint16_be( bfile, data->color_name_index ); pos += 2;
        bf_put_uint16_be( bfile, data->alternate_color_name_index ); pos += 2;
        bf_put_int8( bfile, data->reserved1 ); pos += 1;
        bf_put_int8( bfile, data->billboard_flags ); pos += 1;
        bf_put_int16_be( bfile, data->detail_texture_pattern_index ); pos += 2;
        bf_put_int16_be( bfile, data->texture_pattern_index ); pos += 2;
        bf_put_int16_be( bfile, data->material_index ); pos += 2;
        bf_put_int16_be( bfile, data->surface_material_code ); pos += 2;
        bf_put_int16_be( bfile, data->feature_id ); pos += 2;
        bf_put_int32_be( bfile, data->ir_material_code ); pos += 4;
        bf_put_uint16_be( bfile, data->transparency ); pos += 2;
        bf_put_uint8( bfile, data->lod_generation_control ); pos += 1;
        bf_put_uint8( bfile, data->line_style_index ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        if ( node->length < (pos + 1) ) break;
        bf_put_uint8( bfile, data->light_mode ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        bf_put_uint8( bfile, data->reserved2 ); pos += 1;
        if ( node->length < (pos + 2) ) break;
        bf_put_uint16_be( bfile, data->reserved3 ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->reserved4 ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->packed_color_primary ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->packed_color_alternate ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->texture_mapping_index ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved5 ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->primary_color_index ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->alternate_color_index ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved6 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved7 ); pos += 2;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}